

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

Am_Object if_list_get_obj(Am_Value *v,bool only_if_one)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *in_value;
  char in_DL;
  undefined7 in_register_00000031;
  Am_Value_List v_list;
  Am_Value_List local_30;
  
  bVar1 = Am_Value_List::Test((Am_Value *)CONCAT71(in_register_00000031,only_if_one));
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_30);
    Am_Value_List::operator=(&local_30,(Am_Value *)CONCAT71(in_register_00000031,only_if_one));
    if (in_DL != '\0') {
      uVar2 = Am_Value_List::Length(&local_30);
      if (uVar2 != 1) {
        Am_Value_List::~Am_Value_List(&local_30);
        goto LAB_00219d27;
      }
    }
    Am_Value_List::Start(&local_30);
    in_value = Am_Value_List::Get(&local_30);
    Am_Object::Am_Object((Am_Object *)v,in_value);
    Am_Value_List::~Am_Value_List(&local_30);
  }
  else {
LAB_00219d27:
    Am_Object::Am_Object((Am_Object *)v,&Am_No_Object);
  }
  return (Am_Object)(Am_Object_Data *)v;
}

Assistant:

Am_Object
if_list_get_obj(Am_Value v, bool only_if_one)
{
  if (Am_Value_List::Test(v)) {
    Am_Value_List v_list;
    v_list = v;
    if (!only_if_one || (v_list.Length() == 1)) {
      v_list.Start();
      Am_Object o = v_list.Get();
      return o;
    }
  }
  return Am_No_Object;
}